

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O3

vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
* __thiscall
libtorrent::aux::piece_picker::get_download_queue
          (vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
           *__return_storage_ptr__,piece_picker *this)

{
  long lVar1;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = 0;
  do {
    ::std::
    vector<libtorrent::aux::piece_picker::downloading_piece,std::allocator<libtorrent::aux::piece_picker::downloading_piece>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<libtorrent::aux::piece_picker::downloading_piece_const*,std::vector<libtorrent::aux::piece_picker::downloading_piece,std::allocator<libtorrent::aux::piece_picker::downloading_piece>>>>
              ((vector<libtorrent::aux::piece_picker::downloading_piece,std::allocator<libtorrent::aux::piece_picker::downloading_piece>>
                *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               *(undefined8 *)
                ((long)&(this->m_downloads).
                        super_array<libtorrent::aux::container_wrapper<libtorrent::aux::piece_picker::downloading_piece,_int,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>,_4UL>
                        ._M_elems[0].
                        super_vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                        .
                        super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                        ._M_impl.super__Vector_impl_data + lVar1),
               *(undefined8 *)
                ((long)&(this->m_downloads).
                        super_array<libtorrent::aux::container_wrapper<libtorrent::aux::piece_picker::downloading_piece,_int,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>,_4UL>
                        ._M_elems[0].
                        super_vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                        .
                        super__Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                        ._M_impl.super__Vector_impl_data + lVar1 + 8));
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<piece_picker::downloading_piece> piece_picker::get_download_queue() const
	{
#if TORRENT_USE_INVARIANT_CHECKS
		check_piece_state();
#endif

		std::vector<downloading_piece> ret;
		for (auto const& c : m_downloads)
			ret.insert(ret.end(), c.begin(), c.end());
		return ret;
	}